

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

void UpdateAllSourceProps(ALCcontext *context)

{
  __atomic_flag_data_type _Var1;
  ALuint id;
  __pointer_type pFVar2;
  __int_type_conflict2 _Var3;
  Voice *voice;
  ALsource *source;
  long lVar4;
  
  std::mutex::lock(&context->mSourceLock);
  pFVar2 = (context->mVoices)._M_b._M_p;
  _Var3 = (context->mActiveVoiceCount).super___atomic_base<unsigned_long>._M_i;
  for (lVar4 = 0; _Var3 << 3 != lVar4; lVar4 = lVar4 + 8) {
    voice = *(Voice **)((long)&pFVar2->field_1 + lVar4);
    id = (voice->mSourceID).super___atomic_base<unsigned_int>._M_i;
    if (id != 0) {
      source = anon_unknown.dwarf_50b73::LookupSource(context,id);
      if (source != (ALsource *)0x0) {
        LOCK();
        _Var1 = (source->PropsClean).super___atomic_flag_base._M_i;
        (source->PropsClean).super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var1 == false) {
          anon_unknown.dwarf_50b73::UpdateSourceProps(source,voice,context);
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&context->mSourceLock);
  return;
}

Assistant:

void UpdateAllSourceProps(ALCcontext *context)
{
    std::lock_guard<std::mutex> _{context->mSourceLock};
    auto voicelist = context->getVoicesSpan();
    std::for_each(voicelist.begin(), voicelist.end(),
        [context](Voice *voice) -> void
        {
            ALuint sid{voice->mSourceID.load(std::memory_order_acquire)};
            ALsource *source = sid ? LookupSource(context, sid) : nullptr;
            if(source && !source->PropsClean.test_and_set(std::memory_order_acq_rel))
                UpdateSourceProps(source, voice, context);
        }
    );
}